

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallLists(void)

{
  int iVar1;
  JL_STATUS JVar2;
  bool bVar3;
  _Bool _result_65;
  _Bool _result_64;
  _Bool _result_63;
  _Bool _result_62;
  _Bool _result_61;
  _Bool _result_60;
  _Bool _result_59;
  _Bool _result_58;
  _Bool _result_57;
  _Bool _result_56;
  _Bool _result_55;
  _Bool _result_54;
  _Bool _result_53;
  _Bool _result_52;
  _Bool _result_51;
  _Bool _result_50;
  _Bool _result_49;
  _Bool _result_48;
  _Bool _result_47;
  _Bool _result_46;
  _Bool _result_45;
  _Bool _result_44;
  _Bool _result_43;
  _Bool _result_42;
  _Bool _result_41;
  _Bool _result_40;
  _Bool _result_39;
  _Bool _result_38;
  _Bool _result_37;
  _Bool _result_36;
  _Bool _result_35;
  _Bool _result_34;
  _Bool _result_33;
  _Bool _result_32;
  _Bool _result_31;
  _Bool _result_30;
  _Bool _result_29;
  _Bool _result_28;
  _Bool _result_27;
  _Bool _result_26;
  _Bool _result_25;
  _Bool _result_24;
  _Bool _result_23;
  _Bool _result_22;
  _Bool _result_21;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [2];
  JlMarshallElement marshalSubStruct [2];
  JlMarshallElement marshalSubSubStruct [1];
  size_t errorAtPos;
  WJTL_STATUS TestReturn;
  
  errorAtPos._4_4_ = WJTL_STATUS_SUCCESS;
  marshalSubSubStruct[0].ChildStructDescriptionCount = 0;
  marshalSubSubStruct[0]._92_4_ = 0;
  memcpy(&marshalSubStruct[1].ChildStructDescriptionCount,&DAT_0014f6b0,0x60);
  marshalTheStruct[1].ChildStructDescriptionCount = 5;
  marshalSubStruct[0]._0_8_ = anon_var_dwarf_92e4;
  marshalSubStruct[0].Name._0_1_ = 1;
  marshalSubStruct[0].IsArray = false;
  marshalSubStruct[0]._17_7_ = 0;
  marshalSubStruct[0].FieldOffset = 0x10;
  marshalSubStruct[0].FieldSize = 0x10;
  marshalSubStruct[0].CountFieldOffset = 8;
  marshalSubStruct[0].CountFieldSize = 0x10;
  marshalSubStruct[0].ArrayFieldSize = 4;
  marshalSubStruct[0].ArrayItemSize._0_4_ = 0;
  marshalSubStruct[0].ArrayItemSize._4_1_ = 0;
  marshalSubStruct[0].ArrayItemSize._5_1_ = 0;
  marshalSubStruct[0]._72_8_ = &marshalSubStruct[1].ChildStructDescriptionCount;
  marshalSubStruct[0].ChildStructDescription._0_4_ = 1;
  marshalSubStruct[0].ChildStructDescriptionCount = 5;
  marshalSubStruct[1]._0_8_ = anon_var_dwarf_92f0;
  marshalSubStruct[1].Name._0_1_ = 1;
  marshalSubStruct[1].IsArray = true;
  marshalSubStruct[1]._17_7_ = 0;
  marshalSubStruct[1].FieldOffset = 8;
  marshalSubStruct[1].FieldSize = 0x20;
  marshalSubStruct[1].CountFieldOffset = 8;
  marshalSubStruct[1].CountFieldSize = 0;
  marshalSubStruct[1].ArrayFieldSize = 4;
  marshalSubStruct[1].ArrayItemSize._0_4_ = 0;
  marshalSubStruct[1].ArrayItemSize._4_1_ = 0;
  marshalSubStruct[1].ArrayItemSize._5_1_ = 0;
  marshalSubStruct[1]._72_8_ = &marshalSubStruct[1].ChildStructDescriptionCount;
  marshalSubStruct[1].ChildStructDescription._0_4_ = 1;
  theStruct.SubVarListCount._0_4_ = 5;
  marshalTheStruct[0]._0_8_ = (long)"SubSubFixList" + 3;
  marshalTheStruct[0].Name._0_1_ = 1;
  marshalTheStruct[0].IsArray = false;
  marshalTheStruct[0]._17_7_ = 0;
  marshalTheStruct[0].FieldOffset = 0xa0;
  marshalTheStruct[0].FieldSize = 0xa0;
  marshalTheStruct[0].CountFieldOffset = 8;
  marshalTheStruct[0].CountFieldSize = 0xa0;
  marshalTheStruct[0].ArrayFieldSize = 0x28;
  marshalTheStruct[0].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[0].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[0].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[0]._72_8_ = &marshalTheStruct[1].ChildStructDescriptionCount;
  marshalTheStruct[0].ChildStructDescription._0_4_ = 2;
  marshalTheStruct[0].ChildStructDescriptionCount = 5;
  marshalTheStruct[1]._0_8_ = (long)"SubSubVarList" + 3;
  marshalTheStruct[1].Name._0_1_ = 1;
  marshalTheStruct[1].IsArray = true;
  marshalTheStruct[1]._17_7_ = 0;
  marshalTheStruct[1].FieldOffset = 8;
  marshalTheStruct[1].FieldSize = 0xb0;
  marshalTheStruct[1].CountFieldOffset = 8;
  marshalTheStruct[1].CountFieldSize = 0;
  marshalTheStruct[1].ArrayFieldSize = 0x28;
  marshalTheStruct[1].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[1].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[1].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[1]._72_8_ = &marshalTheStruct[1].ChildStructDescriptionCount;
  marshalTheStruct[1].ChildStructDescription._0_4_ = 2;
  memset(&_result_7,0,0xb8);
  JVar2 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":1},{\"Num\":2}], \"SubSubVarList\": [{\"Num\":3},{\"Num\":4}] },    { \"SubSubFixList\": [{\"Num\":5},{\"Num\":6}], \"SubSubVarList\": [{\"Num\":7},{\"Num\":8}] }  ],  \"SubVarList\":[     { \"SubSubFixList\": [{\"Num\":9},{\"Num\":10}], \"SubSubVarList\": [{\"Num\":11},{\"Num\":12}] },    { \"SubSubFixList\": [{\"Num\":13},{\"Num\":14}], \"SubSubVarList\": [{\"Num\":15},{\"Num\":16}] }  ]}"
                         ,(JlMarshallElement *)&theStruct.SubVarListCount,2,&_result_7,
                         (size_t *)&marshalSubSubStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":1},{\\\"Num\\\":2}], \\\"SubSubVarList\\\": [{\\\"Num\\\":3},{\\\"Num\\\":4}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":5},{\\\"Num\\\":6}], \\\"SubSubVarList\\\": [{\\\"Num\\\":7},{\\\"Num\\\":8}] }\" \"  ],\" \"  \\\"SubVarList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":9},{\\\"Num\\\":10}], \\\"SubSubVarList\\\": [{\\\"Num\\\":11},{\\\"Num\\\":12}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":13},{\\\"Num\\\":14}], \\\"SubSubVarList\\\": [{\\\"Num\\\":15},{\\\"Num\\\":16}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fb);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalSubSubStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fd);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[3].SubSubVarListCount == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5fe);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[0].SubSubFixList._8_8_ == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x5ff);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_7 == 1;
  WjTestLib_Assert(bVar3,"1 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x600);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_3 == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x601);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[0].SubSubVarList == (SubSubStruct *)0x2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x602);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixList[0].SubSubFixListCount;
  WjTestLib_Assert(iVar1 == 3,"3 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x603);
  if (iVar1 != 3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixList[0].SubSubFixListCount + 4) == 4;
  WjTestLib_Assert(bVar3,"4 == theStruct.SubFixList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x604);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[1].SubSubFixList._8_8_ == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x605);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = (int)theStruct.SubFixList[0].SubSubVarListCount == 5;
  WjTestLib_Assert(bVar3,"5 == theStruct.SubFixList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x606);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[0].SubSubVarListCount._4_4_ == 6;
  WjTestLib_Assert(bVar3,"6 == theStruct.SubFixList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x607);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[1].SubSubVarList == (SubSubStruct *)0x2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x608);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixList[1].SubSubFixListCount;
  WjTestLib_Assert(iVar1 == 7,"7 == theStruct.SubFixList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x609);
  if (iVar1 != 7) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixList[1].SubSubFixListCount + 4) == 8;
  WjTestLib_Assert(bVar3,"8 == theStruct.SubFixList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60a);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x10) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60c);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixListCount;
  WjTestLib_Assert(iVar1 == 9,"9 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60d);
  if (iVar1 != 9) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixListCount + 4) == 10;
  WjTestLib_Assert(bVar3,"10 == theStruct.SubVarList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60e);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x20) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x60f);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = **(int **)(theStruct.SubFixListCount + 0x18) == 0xb;
  WjTestLib_Assert(bVar3,"11 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x610);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(*(long *)(theStruct.SubFixListCount + 0x18) + 4) == 0xc;
  WjTestLib_Assert(bVar3,"12 == theStruct.SubVarList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x611);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x38) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x612);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixListCount + 0x28) == 0xd;
  WjTestLib_Assert(bVar3,"13 == theStruct.SubVarList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x613);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixListCount + 0x2c) == 0xe;
  WjTestLib_Assert(bVar3,"14 == theStruct.SubVarList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x614);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x48) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x615);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = **(int **)(theStruct.SubFixListCount + 0x40) == 0xf;
  WjTestLib_Assert(bVar3,"15 == theStruct.SubVarList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x616);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(*(long *)(theStruct.SubFixListCount + 0x40) + 4) == 0x10;
  WjTestLib_Assert(bVar3,"16 == theStruct.SubVarList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x617);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":41},{\"Num\":42}], \"SubSubVarList\": [{\"Num\":43},{\"Num\":44}] },    { \"SubSubFixList\": [{\"Num\":45},{\"Num\":46}], \"SubSubVarList\": [{\"Num\":47},{\"Num\":48}] }  ]}"
                         ,(JlMarshallElement *)&theStruct.SubVarListCount,2,&_result_7,
                         (size_t *)&marshalSubSubStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":41},{\\\"Num\\\":42}], \\\"SubSubVarList\\\": [{\\\"Num\\\":43},{\\\"Num\\\":44}] },\" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":45},{\\\"Num\\\":46}], \\\"SubSubVarList\\\": [{\\\"Num\\\":47},{\\\"Num\\\":48}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x621);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalSubSubStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x623);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[3].SubSubVarListCount == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x624);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[0].SubSubFixList._8_8_ == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x625);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = __result_7 == 0x29;
  WjTestLib_Assert(bVar3,"41 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x626);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(__result_3 == 0x2a,"42 == theStruct.SubFixList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x627);
  if (__result_3 != 0x2a) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.SubFixList[0].SubSubVarList == (SubSubStruct *)0x2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x628);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixList[0].SubSubFixListCount;
  WjTestLib_Assert(iVar1 == 0x2b,"43 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x629);
  if (iVar1 != 0x2b) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixList[0].SubSubFixListCount + 4) == 0x2c;
  WjTestLib_Assert(bVar3,"44 == theStruct.SubFixList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62a);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.SubFixList[1].SubSubFixList._8_8_ == 2,
                   "2 == theStruct.SubFixList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62b);
  if (theStruct.SubFixList[1].SubSubFixList._8_8_ != 2) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert((int)theStruct.SubFixList[0].SubSubVarListCount == 0x2d,
                   "45 == theStruct.SubFixList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62c);
  if ((int)theStruct.SubFixList[0].SubSubVarListCount != 0x2d) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubVarListCount._4_4_ == 0x2e,
                   "46 == theStruct.SubFixList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62d);
  if (theStruct.SubFixList[0].SubSubVarListCount._4_4_ != 0x2e) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.SubFixList[1].SubSubVarList == (SubSubStruct *)0x2,
                   "2 == theStruct.SubFixList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62e);
  if (theStruct.SubFixList[1].SubSubVarList != (SubSubStruct *)0x2) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixList[1].SubSubFixListCount;
  WjTestLib_Assert(iVar1 == 0x2f,"47 == theStruct.SubFixList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x62f);
  if (iVar1 != 0x2f) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixList[1].SubSubFixListCount + 4) == 0x30;
  WjTestLib_Assert(bVar3,"48 == theStruct.SubFixList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x630);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x10) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x632);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixListCount;
  WjTestLib_Assert(iVar1 == 9,"9 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x633);
  if (iVar1 != 9) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixListCount + 4) == 10;
  WjTestLib_Assert(bVar3,"10 == theStruct.SubVarList[0].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x634);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x20) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x635);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = **(int **)(theStruct.SubFixListCount + 0x18) == 0xb;
  WjTestLib_Assert(bVar3,"11 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x636);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(*(long *)(theStruct.SubFixListCount + 0x18) + 4) == 0xc;
  WjTestLib_Assert(bVar3,"12 == theStruct.SubVarList[0].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x637);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x38) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[1].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x638);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixListCount + 0x28) == 0xd;
  WjTestLib_Assert(bVar3,"13 == theStruct.SubVarList[1].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x639);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(theStruct.SubFixListCount + 0x2c) == 0xe;
  WjTestLib_Assert(bVar3,"14 == theStruct.SubVarList[1].SubSubFixList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63a);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x48) == 2;
  WjTestLib_Assert(bVar3,"2 == theStruct.SubVarList[1].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63b);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = **(int **)(theStruct.SubFixListCount + 0x40) == 0xf;
  WjTestLib_Assert(bVar3,"15 == theStruct.SubVarList[1].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63c);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(int *)(*(long *)(theStruct.SubFixListCount + 0x40) + 4) == 0x10;
  WjTestLib_Assert(bVar3,"16 == theStruct.SubVarList[1].SubSubVarList[1].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x63d);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlJsonToStruct("{  \"SubFixList\":[     { \"SubSubFixList\": [{\"Num\":20}], \"SubSubVarList\": [{\"Num\":21}] }  ],  \"SubVarList\":[     { \"SubSubFixList\": [{\"Num\":22}], \"SubSubVarList\": [{\"Num\":23}] }  ]}"
                         ,(JlMarshallElement *)&theStruct.SubVarListCount,2,&_result_7,
                         (size_t *)&marshalSubSubStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\" \"  \\\"SubFixList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":20}], \\\"SubSubVarList\\\": [{\\\"Num\\\":21}] }\" \"  ],\" \"  \\\"SubVarList\\\":[ \" \"    { \\\"SubSubFixList\\\": [{\\\"Num\\\":22}], \\\"SubSubVarList\\\": [{\\\"Num\\\":23}] }\" \"  ]\" \"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x649);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalSubSubStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64b);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.SubFixList[3].SubSubVarListCount == 1,"1 == theStruct.SubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64c);
  if (theStruct.SubFixList[3].SubSubVarListCount != 1) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubFixList._8_8_ == 1,
                   "1 == theStruct.SubFixList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64d);
  if (theStruct.SubFixList[0].SubSubFixList._8_8_ != 1) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(__result_7 == 0x14,"20 == theStruct.SubFixList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64e);
  if (__result_7 != 0x14) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.SubFixList[0].SubSubVarList == (SubSubStruct *)0x1,
                   "1 == theStruct.SubFixList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x64f);
  if (theStruct.SubFixList[0].SubSubVarList != (SubSubStruct *)0x1) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixList[0].SubSubFixListCount;
  WjTestLib_Assert(iVar1 == 0x15,"21 == theStruct.SubFixList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x650);
  if (iVar1 != 0x15) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x10) == 1;
  WjTestLib_Assert(bVar3,"1 == theStruct.SubVarList[0].SubSubFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x652);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *(int *)theStruct.SubFixListCount;
  WjTestLib_Assert(iVar1 == 0x16,"22 == theStruct.SubVarList[0].SubSubFixList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x653);
  if (iVar1 != 0x16) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = *(long *)(theStruct.SubFixListCount + 0x20) == 1;
  WjTestLib_Assert(bVar3,"1 == theStruct.SubVarList[0].SubSubVarListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x654);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = **(int **)(theStruct.SubFixListCount + 0x18) == 0x17;
  WjTestLib_Assert(bVar3,"23 == theStruct.SubVarList[0].SubSubVarList[0].Num",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x655);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlUnmarshallFreeStructAllocs((JlMarshallElement *)&theStruct.SubVarListCount,2,&_result_7)
  ;
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallLists",0x658);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  return errorAtPos._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallLists
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint32_t        Num;
    } SubSubStruct;

    typedef struct
    {
        SubSubStruct   SubSubFixList [4];
        size_t         SubSubFixListCount;
        SubSubStruct*  SubSubVarList;
        size_t         SubSubVarListCount;
    } SubStruct;

    typedef struct
    {
        SubStruct   SubFixList [4];
        size_t      SubFixListCount;
        SubStruct*  SubVarList;
        size_t      SubVarListCount;
    } TheStruct;

    JlMarshallElement marshalSubSubStruct[] = {
        JlMarshallUnsigned( SubSubStruct, Num, "Num" )
    };

    JlMarshallElement marshalSubStruct[] = {
        JlMarshallStructFixedArray( SubStruct, SubSubFixList, SubSubFixListCount, "SubSubFixList", SubSubStruct, marshalSubSubStruct, NumElements(marshalSubSubStruct) ),
        JlMarshallStructArray( SubStruct, SubSubVarList, SubSubVarListCount, "SubSubVarList", SubSubStruct, marshalSubSubStruct, NumElements(marshalSubSubStruct) )
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStructFixedArray( TheStruct, SubFixList, SubFixListCount, "SubFixList", SubStruct, marshalSubStruct, NumElements(marshalSubStruct) ),
        JlMarshallStructArray( TheStruct, SubVarList, SubVarListCount, "SubVarList", SubStruct, marshalSubStruct, NumElements(marshalSubStruct) )
    };

    TheStruct theStruct = {{{{{0}}}}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":1},{\"Num\":2}], \"SubSubVarList\": [{\"Num\":3},{\"Num\":4}] },"
        "    { \"SubSubFixList\": [{\"Num\":5},{\"Num\":6}], \"SubSubVarList\": [{\"Num\":7},{\"Num\":8}] }"
        "  ],"
        "  \"SubVarList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":9},{\"Num\":10}], \"SubSubVarList\": [{\"Num\":11},{\"Num\":12}] },"
        "    { \"SubSubFixList\": [{\"Num\":13},{\"Num\":14}], \"SubSubVarList\": [{\"Num\":15},{\"Num\":16}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.SubFixListCount );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubFixList[0].Num );
        JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 3 == theStruct.SubFixList[0].SubSubVarList[0].Num );
        JL_ASSERT( 4 == theStruct.SubFixList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubFixListCount );
        JL_ASSERT( 5 == theStruct.SubFixList[1].SubSubFixList[0].Num );
        JL_ASSERT( 6 == theStruct.SubFixList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubVarListCount );
        JL_ASSERT( 7 == theStruct.SubFixList[1].SubSubVarList[0].Num );
        JL_ASSERT( 8 == theStruct.SubFixList[1].SubSubVarList[1].Num );

      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 9 == theStruct.SubVarList[0].SubSubFixList[0].Num );
        JL_ASSERT( 10 == theStruct.SubVarList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 11 == theStruct.SubVarList[0].SubSubVarList[0].Num );
        JL_ASSERT( 12 == theStruct.SubVarList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubFixListCount );
        JL_ASSERT( 13 == theStruct.SubVarList[1].SubSubFixList[0].Num );
        JL_ASSERT( 14 == theStruct.SubVarList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubVarListCount );
        JL_ASSERT( 15 == theStruct.SubVarList[1].SubSubVarList[0].Num );
        JL_ASSERT( 16 == theStruct.SubVarList[1].SubSubVarList[1].Num );

    // Partial replace
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":41},{\"Num\":42}], \"SubSubVarList\": [{\"Num\":43},{\"Num\":44}] },"
        "    { \"SubSubFixList\": [{\"Num\":45},{\"Num\":46}], \"SubSubVarList\": [{\"Num\":47},{\"Num\":48}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.SubFixListCount );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 41 == theStruct.SubFixList[0].SubSubFixList[0].Num );
        JL_ASSERT( 42 == theStruct.SubFixList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 43 == theStruct.SubFixList[0].SubSubVarList[0].Num );
        JL_ASSERT( 44 == theStruct.SubFixList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubFixListCount );
        JL_ASSERT( 45 == theStruct.SubFixList[1].SubSubFixList[0].Num );
        JL_ASSERT( 46 == theStruct.SubFixList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubFixList[1].SubSubVarListCount );
        JL_ASSERT( 47 == theStruct.SubFixList[1].SubSubVarList[0].Num );
        JL_ASSERT( 48 == theStruct.SubFixList[1].SubSubVarList[1].Num );
      // Rest should be same from before
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 9 == theStruct.SubVarList[0].SubSubFixList[0].Num );
        JL_ASSERT( 10 == theStruct.SubVarList[0].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 11 == theStruct.SubVarList[0].SubSubVarList[0].Num );
        JL_ASSERT( 12 == theStruct.SubVarList[0].SubSubVarList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubFixListCount );
        JL_ASSERT( 13 == theStruct.SubVarList[1].SubSubFixList[0].Num );
        JL_ASSERT( 14 == theStruct.SubVarList[1].SubSubFixList[1].Num );
      JL_ASSERT( 2 == theStruct.SubVarList[1].SubSubVarListCount );
        JL_ASSERT( 15 == theStruct.SubVarList[1].SubSubVarList[0].Num );
        JL_ASSERT( 16 == theStruct.SubVarList[1].SubSubVarList[1].Num );

    // Replace with some values
    JL_ASSERT_SUCCESS( JlJsonToStruct(
        "{"
        "  \"SubFixList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":20}], \"SubSubVarList\": [{\"Num\":21}] }"
        "  ],"
        "  \"SubVarList\":[ "
        "    { \"SubSubFixList\": [{\"Num\":22}], \"SubSubVarList\": [{\"Num\":23}] }"
        "  ]"
        "}",
        marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );

    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.SubFixListCount );
      JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubFixListCount );
        JL_ASSERT( 20 == theStruct.SubFixList[0].SubSubFixList[0].Num );
      JL_ASSERT( 1 == theStruct.SubFixList[0].SubSubVarListCount );
        JL_ASSERT( 21 == theStruct.SubFixList[0].SubSubVarList[0].Num );

      JL_ASSERT( 1 == theStruct.SubVarList[0].SubSubFixListCount );
        JL_ASSERT( 22 == theStruct.SubVarList[0].SubSubFixList[0].Num );
      JL_ASSERT( 1 == theStruct.SubVarList[0].SubSubVarListCount );
        JL_ASSERT( 23 == theStruct.SubVarList[0].SubSubVarList[0].Num );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}